

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaVAddNodeQName(xmlSchemaValidCtxtPtr vctxt,xmlChar *lname,xmlChar *nsname)

{
  int iVar1;
  xmlChar *item;
  int local_2c;
  xmlChar *pxStack_28;
  int i;
  xmlChar *nsname_local;
  xmlChar *lname_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  item = xmlDictLookup(vctxt->dict,lname,-1);
  if (item == (xmlChar *)0x0) {
    vctxt_local._4_4_ = -1;
  }
  else {
    pxStack_28 = nsname;
    if ((nsname == (xmlChar *)0x0) ||
       (pxStack_28 = xmlDictLookup(vctxt->dict,nsname,-1), pxStack_28 != (xmlChar *)0x0)) {
      for (local_2c = 0; local_2c < vctxt->nodeQNames->nbItems; local_2c = local_2c + 2) {
        if (((xmlChar *)vctxt->nodeQNames->items[local_2c] == item) &&
           ((xmlChar *)vctxt->nodeQNames->items[local_2c + 1] == pxStack_28)) {
          return local_2c;
        }
      }
      vctxt_local._4_4_ = vctxt->nodeQNames->nbItems;
      iVar1 = xmlSchemaItemListAdd(vctxt->nodeQNames,item);
      if (iVar1 < 0) {
        xmlSchemaVErrMemory(vctxt);
        vctxt_local._4_4_ = -1;
      }
      else {
        iVar1 = xmlSchemaItemListAdd(vctxt->nodeQNames,pxStack_28);
        if (iVar1 < 0) {
          vctxt->nodeQNames->nbItems = vctxt->nodeQNames->nbItems + -1;
          xmlSchemaVErrMemory(vctxt);
          vctxt_local._4_4_ = -1;
        }
      }
    }
    else {
      vctxt_local._4_4_ = -1;
    }
  }
  return vctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaVAddNodeQName(xmlSchemaValidCtxtPtr vctxt,
		       const xmlChar* lname,
		       const xmlChar* nsname)
{
    int i;

    lname = xmlDictLookup(vctxt->dict, lname, -1);
    if (lname == NULL)
	return(-1);
    if (nsname != NULL) {
	nsname = xmlDictLookup(vctxt->dict, nsname, -1);
	if (nsname == NULL)
	    return(-1);
    }
    for (i = 0; i < vctxt->nodeQNames->nbItems; i += 2) {
	if ((vctxt->nodeQNames->items [i] == lname) &&
	    (vctxt->nodeQNames->items[i +1] == nsname))
	    /* Already there */
	    return(i);
    }
    /* Add new entry. */
    i = vctxt->nodeQNames->nbItems;
    if (xmlSchemaItemListAdd(vctxt->nodeQNames, (void *) lname) < 0) {
        xmlSchemaVErrMemory(vctxt);
        return(-1);
    }
    if (xmlSchemaItemListAdd(vctxt->nodeQNames, (void *) nsname) < 0) {
        vctxt->nodeQNames->nbItems--;
        xmlSchemaVErrMemory(vctxt);
        return(-1);
    }
    return(i);
}